

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Request * __thiscall
kj::anon_unknown_36::NetworkHttpClient::request
          (Request *__return_storage_ptr__,NetworkHttpClient *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  HttpClient *pHVar1;
  int __flags;
  void *__child_stack;
  void *__arg;
  HttpHeaders *pHVar2;
  HttpHeaderId id;
  StringPtr url_00;
  Maybe<unsigned_long> local_208;
  StringPtr local_1f8;
  ArrayPtr<const_char> local_1e8;
  undefined8 local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1c8 [8];
  HttpHeaders headersCopy;
  undefined1 local_158 [8];
  String path;
  undefined1 local_120 [8];
  Url parsed;
  Options urlOptions;
  HttpHeaders *headers_local;
  HttpMethod method_local;
  NetworkHttpClient *this_local;
  StringPtr url_local;
  
  pHVar2 = headers;
  UrlOptions::UrlOptions((UrlOptions *)&parsed.field_0xde);
  parsed._222_2_ = 0x100;
  path.content.disposer._6_2_ = 0x100;
  __arg = (void *)0x100;
  url_00.content.size_ = 1;
  url_00.content.ptr = (char *)url.content.size_;
  __flags = 1;
  Url::parse((Url *)local_120,(Url *)url.content.ptr,url_00,0x100,SUB82(pHVar2,0));
  Url::toString((String *)local_158,(Url *)local_120,HTTP_REQUEST);
  HttpHeaders::clone((HttpHeaders *)local_1c8,(__fn *)headers,__child_stack,__flags,__arg);
  local_1d8 = 0;
  uStack_1d0 = 0xb;
  uStack_1cc = 0;
  StringPtr::StringPtr
            ((StringPtr *)&local_1e8,
             (String *)
             &parsed.userInfo.ptr.field_1.value.password.ptr.field_1.value.content.disposer);
  id.id = uStack_1d0;
  id.table = (HttpHeaderTable *)local_1d8;
  id._12_4_ = 0;
  HttpHeaders::set((HttpHeaders *)local_1c8,id,(StringPtr)local_1e8);
  pHVar1 = getClient(this,(Url *)local_120);
  StringPtr::StringPtr(&local_1f8,(String *)local_158);
  Maybe<unsigned_long>::Maybe(&local_208,expectedBodySize);
  (**pHVar1->_vptr_HttpClient)
            (__return_storage_ptr__,pHVar1,(ulong)method,local_1f8.content.ptr,
             local_1f8.content.size_,local_1c8,&local_208);
  Maybe<unsigned_long>::~Maybe(&local_208);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_1c8);
  String::~String((String *)local_158);
  Url::~Url((Url *)local_120);
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    // We need to parse the proxy-style URL to convert it to host-style.
    // Use URL parsing options that avoid unnecessary rewrites.
    Url::Options urlOptions;
    urlOptions.allowEmpty = true;
    urlOptions.percentDecode = false;

    auto parsed = Url::parse(url, Url::HTTP_PROXY_REQUEST, urlOptions);
    auto path = parsed.toString(Url::HTTP_REQUEST);
    auto headersCopy = headers.clone();
    headersCopy.set(HttpHeaderId::HOST, parsed.host);
    return getClient(parsed).request(method, path, headersCopy, expectedBodySize);
  }